

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void crec_copy(jit_State *J,TRef trdst,TRef trsrc,TRef trlen,CType *ct)

{
  uint len_00;
  CTState *cts_00;
  bool bVar1;
  CType *cct;
  CTState *cts;
  IRType local_198;
  int needxbar;
  IRType tp;
  CTSize len;
  CTSize step;
  MSize mlp;
  CRecMemList ml [16];
  CType *ct_local;
  TRef trlen_local;
  TRef trsrc_local;
  TRef trdst_local;
  jit_State *J_local;
  
  ml[0xf]._8_8_ = ct;
  if (0x7fff < (trlen & 0xffff)) goto LAB_001b8e19;
  len_00 = (J->cur).ir[trlen & 0xffff].field_1.op12;
  local_198 = IRT_CDATA;
  bVar1 = false;
  if (len_00 == 0) {
    return;
  }
  if (0x80 < len_00) goto LAB_001b8e19;
  if (ct == (CType *)0x0) {
LAB_001b8d5c:
    bVar1 = true;
    tp = IRT_FUNC;
LAB_001b8d70:
    len = crec_copy_unroll((CRecMemList *)&step,len_00,tp,local_198);
  }
  else {
    cts_00 = *(CTState **)&J[-1].penalty[0x3c].val;
    J_local = (jit_State *)ct;
    if (ct->info >> 0x1c == 3) {
      do {
        J_local = (jit_State *)(cts_00->tab + ((uint)(J_local->cur).nextgc.gcptr64 & 0xffff));
      } while ((uint)(J_local->cur).nextgc.gcptr64 >> 0x1c == 8);
      local_198 = crec_ct2irt(cts_00,(CType *)J_local);
      if (local_198 == IRT_CDATA) goto LAB_001b8d5c;
      tp = (IRType)"\x04\x04\x04\b\b\x04\b\b\b\b\b\b\b\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"
                   [local_198];
      goto LAB_001b8d70;
    }
    if ((ct->info & 0x800000) != 0) goto LAB_001b8d5c;
    len = crec_copy_struct((CRecMemList *)&step,cts_00,ct);
  }
  if (len != 0) {
    crec_copy_emit(J,(CRecMemList *)&step,len,trdst,trsrc);
    if (!bVar1) {
      return;
    }
    (J->fold).ins.field_0.ot = 0x5a00;
    (J->fold).ins.field_0.op1 = 0;
    (J->fold).ins.field_0.op2 = 0;
    lj_opt_fold(J);
    return;
  }
LAB_001b8e19:
  lj_ir_call(J,IRCALL_memcpy,(ulong)trdst,(ulong)trsrc,(ulong)trlen);
  (J->fold).ins.field_0.ot = 0x5a00;
  (J->fold).ins.field_0.op1 = 0;
  (J->fold).ins.field_0.op2 = 0;
  lj_opt_fold(J);
  return;
}

Assistant:

static void crec_copy(jit_State *J, TRef trdst, TRef trsrc, TRef trlen,
		      CType *ct)
{
  if (tref_isk(trlen)) {  /* Length must be constant. */
    CRecMemList ml[CREC_COPY_MAXUNROLL];
    MSize mlp = 0;
    CTSize step = 1, len = (CTSize)IR(tref_ref(trlen))->i;
    IRType tp = IRT_CDATA;
    int needxbar = 0;
    if (len == 0) return;  /* Shortcut. */
    if (len > CREC_COPY_MAXLEN) goto fallback;
    if (ct) {
      CTState *cts = ctype_ctsG(J2G(J));
      lj_assertJ(ctype_isarray(ct->info) || ctype_isstruct(ct->info),
		 "copy of non-aggregate");
      if (ctype_isarray(ct->info)) {
	CType *cct = ctype_rawchild(cts, ct);
	tp = crec_ct2irt(cts, cct);
	if (tp == IRT_CDATA) goto rawcopy;
	step = lj_ir_type_size[tp];
	lj_assertJ((len & (step-1)) == 0, "copy of fractional size");
      } else if ((ct->info & CTF_UNION)) {
	step = (1u << ctype_align(ct->info));
	goto rawcopy;
      } else {
	mlp = crec_copy_struct(ml, cts, ct);
	goto emitcopy;
      }
    } else {
    rawcopy:
      needxbar = 1;
      if (LJ_TARGET_UNALIGNED || step >= CTSIZE_PTR)
	step = CTSIZE_PTR;
    }
    mlp = crec_copy_unroll(ml, len, step, tp);
  emitcopy:
    if (mlp) {
      crec_copy_emit(J, ml, mlp, trdst, trsrc);
      if (needxbar)
	emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
      return;
    }
  }
fallback:
  /* Call memcpy. Always needs a barrier to disable alias analysis. */
  lj_ir_call(J, IRCALL_memcpy, trdst, trsrc, trlen);
  emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
}